

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR __thiscall
NpyArray::LoadNPZ(NpyArray *this,FILE *fp,uint32_t comprBytes,uint32_t uncomprBytes)

{
  allocator<unsigned_char> *this_00;
  int iVar1;
  ulong uVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t __n;
  EVP_PKEY_CTX *ctx;
  size_t offset;
  LPCSTR ret;
  uchar *puStack_e8;
  int err;
  z_stream d_stream;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferUncompr;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bufferCompr;
  uint32_t uncomprBytes_local;
  uint32_t comprBytes_local;
  FILE *fp_local;
  NpyArray *this_local;
  
  bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = uncomprBytes;
  bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = comprBytes;
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,(ulong)comprBytes,
             &local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  uVar2 = (ulong)(uint32_t)
                 bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  this_00 = (allocator<unsigned_char> *)((long)&d_stream.reserved + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,uVar2,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&d_stream.reserved + 7));
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sVar4 = fread(puVar3,1,(ulong)bufferCompr.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(FILE *)fp);
  if (sVar4 == bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage._4_4_) {
    d_stream.state = (internal_state *)0x0;
    d_stream.zalloc = (alloc_func)0x0;
    d_stream.zfree = (free_func)0x0;
    d_stream.next_in._0_4_ = 0;
    puStack_e8 = (uchar *)0x0;
    iVar1 = inflateInit2_(&stack0xffffffffffffff18,0xfffffff1,"1.2.11",0x70);
    if (iVar1 == 0) {
      d_stream.next_in._0_4_ =
           bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      puStack_e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      d_stream.next_out._0_4_ =
           (uint32_t)
           bufferCompr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      d_stream.total_in =
           (uLong)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      iVar1 = inflate(&stack0xffffffffffffff18,4);
      if ((iVar1 == 1) || (iVar1 == 0)) {
        inflateEnd(&stack0xffffffffffffff18);
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
        ctx = (EVP_PKEY_CTX *)&this->shape;
        this_local = (NpyArray *)
                     ParseHeaderNPY(puVar3,(shape_t *)ctx,&this->wordSize,&this->type,
                                    &this->fortranOrder);
        if (this_local == (NpyArray *)0x0) {
          init(this,ctx);
          uVar2 = (ulong)(uint32_t)
                         bufferCompr.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          sVar5 = SizeBytes(this);
          puVar3 = Data<unsigned_char>(this);
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
          __n = SizeBytes(this);
          memcpy(puVar3,puVar6 + (uVar2 - sVar5),__n);
          this_local = (NpyArray *)0x0;
        }
      }
      else {
        this_local = (NpyArray *)anon_var_dwarf_1b6;
      }
    }
    else {
      this_local = (NpyArray *)anon_var_dwarf_1a0;
    }
  }
  else {
    this_local = (NpyArray *)anon_var_dwarf_148;
  }
  d_stream.reserved._0_4_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return (LPCSTR)this_local;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(FILE* fp, uint32_t comprBytes, uint32_t uncomprBytes)
{
	std::vector<uint8_t> bufferCompr(comprBytes);
	std::vector<uint8_t> bufferUncompr(uncomprBytes);
	if (fread(bufferCompr.data(), 1, comprBytes, fp) != comprBytes)
		return "error: failed fread";

	z_stream d_stream;
	d_stream.zalloc = Z_NULL;
	d_stream.zfree = Z_NULL;
	d_stream.opaque = Z_NULL;
	d_stream.avail_in = 0;
	d_stream.next_in = Z_NULL;
	int err = inflateInit2(&d_stream, -MAX_WBITS);
	if (err != Z_OK)
		return "error: can not init inflate";

	d_stream.avail_in = comprBytes;
	d_stream.next_in = bufferCompr.data();
	d_stream.avail_out = uncomprBytes;
	d_stream.next_out = bufferUncompr.data();
	err = inflate(&d_stream, Z_FINISH);
	if (err != Z_STREAM_END && err != Z_OK)
		return "error: can not uncompress";

	err = inflateEnd(&d_stream);

	LPCSTR ret = ParseHeaderNPY(bufferUncompr.data(), shape, wordSize, type, fortranOrder);
	if (ret != NULL)
		return ret;
	init();
	const size_t offset = uncomprBytes - SizeBytes();
	memcpy(Data(), bufferUncompr.data()+offset, SizeBytes());
	return NULL;
}